

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI.cpp
# Opt level: O0

string * __thiscall A2::dump_abi_cxx11_(string *__return_storage_ptr__,A2 *this)

{
  bool bVar1;
  Type in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string tags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  reference local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *a;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  string atts;
  string output;
  A2 *this_local;
  
  Lexer::typeToString_abi_cxx11_
            ((string *)((long)&atts.field_2 + 8),(Lexer *)(ulong)this->_lextype,in_EDX);
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->_attributes);
  a = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->_attributes);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&a), bVar1) {
    local_78 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end1);
    std::operator+(&local_d8,&local_78->first,"=\'\x1b[33m");
    std::operator+(&local_b8,&local_d8,&local_78->second);
    std::operator+(&local_98,&local_b8,"\x1b[0m\' ");
    std::__cxx11::string::operator+=((string *)&__range1,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)&__range1_1);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->_tags);
  tag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->_tags);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&tag), bVar1) {
    local_128 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    bVar1 = std::operator==(local_128,"BINARY");
    if (bVar1) {
      std::operator+(&local_168,"\x1b[1;37;44m",local_128);
      std::operator+(&local_148,&local_168,"\x1b[0m ");
      std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
    }
    else {
      bVar1 = std::operator==(local_128,"CMD");
      if (bVar1) {
        std::operator+(&local_1a8,"\x1b[1;37;46m",local_128);
        std::operator+(&local_188,&local_1a8,"\x1b[0m ");
        std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      else {
        bVar1 = std::operator==(local_128,"EXT");
        if (bVar1) {
          std::operator+(&local_1e8,"\x1b[1;37;42m",local_128);
          std::operator+(&local_1c8,&local_1e8,"\x1b[0m ");
          std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        else {
          bVar1 = std::operator==(local_128,"HINT");
          if (bVar1) {
            std::operator+(&local_228,"\x1b[1;37;43m",local_128);
            std::operator+(&local_208,&local_228,"\x1b[0m ");
            std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_228);
          }
          else {
            bVar1 = std::operator==(local_128,"FILTER");
            if (bVar1) {
              std::operator+(&local_268,"\x1b[1;37;45m",local_128);
              std::operator+(&local_248,&local_268,"\x1b[0m ");
              std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_248);
              std::__cxx11::string::~string((string *)&local_248);
              std::__cxx11::string::~string((string *)&local_268);
            }
            else {
              bVar1 = std::operator==(local_128,"CONFIG");
              if (bVar1) {
                std::operator+(&local_2a8,"\x1b[1;37;101m",local_128);
                std::operator+(&local_288,&local_2a8,"\x1b[0m ");
                std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_288);
                std::__cxx11::string::~string((string *)&local_288);
                std::__cxx11::string::~string((string *)&local_2a8);
              }
              else {
                bVar1 = std::operator==(local_128,"ID");
                if (bVar1) {
                  std::operator+(&local_2e8,"\x1b[38;5;7m\x1b[48;5;34m",local_128);
                  std::operator+(&local_2c8,&local_2e8,"\x1b[0m ");
                  std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_2c8);
                  std::__cxx11::string::~string((string *)&local_2c8);
                  std::__cxx11::string::~string((string *)&local_2e8);
                }
                else {
                  std::operator+(&local_328,"\x1b[32m",local_128);
                  std::operator+(&local_308,&local_328,"\x1b[0m ");
                  std::__cxx11::string::operator+=((string *)&__range1_1,(string *)&local_308);
                  std::__cxx11::string::~string((string *)&local_308);
                  std::__cxx11::string::~string((string *)&local_328);
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::operator+(&local_368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&atts.field_2 + 8)," ");
  std::operator+(&local_348,&local_368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  std::operator+(__return_storage_ptr__,&local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&__range1_1);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)(atts.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string A2::dump () const
{
  auto output = Lexer::typeToString (_lextype);

  // Dump attributes.
  std::string atts;
  for (auto& a : _attributes)
    atts += a.first + "='\033[33m" + a.second + "\033[0m' ";

  // Dump tags.
  std::string tags;
  for (const auto& tag : _tags)
  {
         if (tag == "BINARY")        tags += "\033[1;37;44m"             + tag + "\033[0m ";
    else if (tag == "CMD")           tags += "\033[1;37;46m"             + tag + "\033[0m ";
    else if (tag == "EXT")           tags += "\033[1;37;42m"             + tag + "\033[0m ";
    else if (tag == "HINT")          tags += "\033[1;37;43m"             + tag + "\033[0m ";
    else if (tag == "FILTER")        tags += "\033[1;37;45m"             + tag + "\033[0m ";
    else if (tag == "CONFIG")        tags += "\033[1;37;101m"            + tag + "\033[0m ";
    else if (tag == "ID")            tags += "\033[38;5;7m\033[48;5;34m" + tag + "\033[0m ";
    else                             tags += "\033[32m"                  + tag + "\033[0m ";
  }

  return output + " " + atts + tags;
}